

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_ObjComputeTruthTableStart(Gia_Man_t *p,int nVarsMax)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  int nVarsMax_local;
  Gia_Man_t *p_local;
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    p->nTtVars = nVarsMax;
    iVar1 = Abc_Truth6WordNum(p->nTtVars);
    p->nTtWords = iVar1;
    pVVar2 = Vec_IntAlloc(0x100);
    p->vTtNodes = pVVar2;
    iVar1 = Abc_MaxInt(6,p->nTtVars);
    pVVar3 = Vec_PtrAllocTruthTables(iVar1);
    p->vTtInputs = pVVar3;
    pVVar4 = Vec_WrdStart(p->nTtWords << 6);
    p->vTtMemory = pVVar4;
    iVar1 = Gia_ManObjNum(p);
    pVVar2 = Vec_IntAlloc(iVar1 + 1000);
    p->vTtNums = pVVar2;
    pVVar2 = p->vTtNums;
    iVar1 = Vec_IntCap(p->vTtNums);
    Vec_IntFill(pVVar2,iVar1,-1000000000);
    return;
  }
  __assert_fail("p->vTtMemory == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                ,0x14a,"void Gia_ObjComputeTruthTableStart(Gia_Man_t *, int)");
}

Assistant:

void Gia_ObjComputeTruthTableStart( Gia_Man_t * p, int nVarsMax )
{
    assert( p->vTtMemory == NULL );
    p->nTtVars   = nVarsMax;
    p->nTtWords  = Abc_Truth6WordNum( p->nTtVars );
    p->vTtNodes  = Vec_IntAlloc( 256 );
    p->vTtInputs = Vec_PtrAllocTruthTables( Abc_MaxInt(6, p->nTtVars) );
    p->vTtMemory = Vec_WrdStart( p->nTtWords * 64 );
    p->vTtNums   = Vec_IntAlloc( Gia_ManObjNum(p) + 1000 );
    Vec_IntFill( p->vTtNums, Vec_IntCap(p->vTtNums), -ABC_INFINITY );
}